

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SolveTriangular.h
# Opt level: O1

void Eigen::internal::
     triangular_solver_selector<const_Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>,_Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>,_1,_5,_0,_-1>
     ::run(Matrix<double,__1,__1,_0,__1,__1> *lhs,Matrix<double,__1,__1,_0,__1,__1> *rhs)

{
  long size;
  long otherSize;
  BlockingType blocking;
  level3_blocking<double,_double> local_78;
  long local_48;
  long local_40;
  long local_38;
  
  size = (lhs->super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>).m_storage.m_rows;
  otherSize = (rhs->super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>).m_storage.
              m_cols;
  local_78.m_mc =
       (rhs->super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>).m_storage.m_rows;
  local_78.m_blockW = (RhsScalar *)0x0;
  local_78.m_blockA = (LhsScalar *)0x0;
  local_78.m_blockB = (RhsScalar *)0x0;
  local_78.m_nc = otherSize;
  local_78.m_kc = size;
  computeProductBlockingSizes<double,double,4,long>(&local_78.m_kc,&local_78.m_mc,&local_78.m_nc);
  local_48 = local_78.m_mc * local_78.m_kc;
  local_40 = local_78.m_nc * local_78.m_kc;
  local_38 = local_78.m_kc << 3;
  triangular_solve_matrix<double,_long,_1,_5,_false,_0,_0>::run
            (size,otherSize,
             (lhs->super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>).m_storage.
             m_data,(lhs->super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>).
                    m_storage.m_rows,
             (rhs->super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>).m_storage.
             m_data,(rhs->super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>).
                    m_storage.m_rows,&local_78);
  free(local_78.m_blockA);
  free(local_78.m_blockB);
  free(local_78.m_blockW);
  return;
}

Assistant:

static void run(const Lhs& lhs, Rhs& rhs)
  {
    typename internal::add_const_on_value_type<ActualLhsType>::type actualLhs = LhsProductTraits::extract(lhs);

    const Index size = lhs.rows();
    const Index othersize = Side==OnTheLeft? rhs.cols() : rhs.rows();

    typedef internal::gemm_blocking_space<(Rhs::Flags&RowMajorBit) ? RowMajor : ColMajor,Scalar,Scalar,
              Rhs::MaxRowsAtCompileTime, Rhs::MaxColsAtCompileTime, Lhs::MaxRowsAtCompileTime,4> BlockingType;

    BlockingType blocking(rhs.rows(), rhs.cols(), size);

    triangular_solve_matrix<Scalar,Index,Side,Mode,LhsProductTraits::NeedToConjugate,(int(Lhs::Flags) & RowMajorBit) ? RowMajor : ColMajor,
                               (Rhs::Flags&RowMajorBit) ? RowMajor : ColMajor>
      ::run(size, othersize, &actualLhs.coeffRef(0,0), actualLhs.outerStride(), &rhs.coeffRef(0,0), rhs.outerStride(), blocking);
  }